

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expand_environment_variables.cpp
# Opt level: O0

string * tlx::expand_environment_variables(string *__return_storage_ptr__,string *s)

{
  string *s_local;
  string *copy;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)s);
  expand_environment_variables(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string expand_environment_variables(const std::string& s) {
    std::string copy = s;
    expand_environment_variables(&copy);
    return copy;
}